

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.c
# Opt level: O0

ma_result ma_linear_resampler_process_pcm_frames
                    (ma_linear_resampler *pResampler,void *pFramesIn,ma_uint64 *pFrameCountIn,
                    void *pFramesOut,ma_uint64 *pFrameCountOut)

{
  ma_uint64 *pFrameCountOut_local;
  void *pFramesOut_local;
  ma_uint64 *pFrameCountIn_local;
  void *pFramesIn_local;
  ma_linear_resampler *pResampler_local;
  
  if (pResampler == (ma_linear_resampler *)0x0) {
    pResampler_local._4_4_ = MA_INVALID_ARGS;
  }
  else if ((pResampler->config).format == ma_format_s16) {
    pResampler_local._4_4_ =
         ma_linear_resampler_process_pcm_frames_s16
                   (pResampler,pFramesIn,pFrameCountIn,pFramesOut,pFrameCountOut);
  }
  else {
    if ((pResampler->config).format != ma_format_f32) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/stoneface86[P]trackerboy/vendored/miniaudio/miniaudio.c"
                    ,0x9890,
                    "ma_result ma_linear_resampler_process_pcm_frames(ma_linear_resampler *, const void *, ma_uint64 *, void *, ma_uint64 *)"
                   );
    }
    pResampler_local._4_4_ =
         ma_linear_resampler_process_pcm_frames_f32
                   (pResampler,pFramesIn,pFrameCountIn,pFramesOut,pFrameCountOut);
  }
  return pResampler_local._4_4_;
}

Assistant:

MA_API ma_result ma_linear_resampler_process_pcm_frames(ma_linear_resampler* pResampler, const void* pFramesIn, ma_uint64* pFrameCountIn, void* pFramesOut, ma_uint64* pFrameCountOut)
{
    if (pResampler == NULL) {
        return MA_INVALID_ARGS;
    }

    /*  */ if (pResampler->config.format == ma_format_s16) {
        return ma_linear_resampler_process_pcm_frames_s16(pResampler, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
    } else if (pResampler->config.format == ma_format_f32) {
        return ma_linear_resampler_process_pcm_frames_f32(pResampler, pFramesIn, pFrameCountIn, pFramesOut, pFrameCountOut);
    } else {
        /* Should never get here. Getting here means the format is not supported and you didn't check the return value of ma_linear_resampler_init(). */
        MA_ASSERT(MA_FALSE);
        return MA_INVALID_ARGS;
    }
}